

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator_factory.cc
# Opt level: O0

MessageGenerator * __thiscall
google::protobuf::compiler::java::ImmutableGeneratorFactory::NewMessageGenerator
          (ImmutableGeneratorFactory *this,Descriptor *descriptor)

{
  bool bVar1;
  Descriptor *descriptor_local;
  ImmutableGeneratorFactory *this_local;
  
  bVar1 = Context::EnforceLite(this->context_);
  bVar1 = HasDescriptorMethods(descriptor,bVar1);
  if (bVar1) {
    this_local = (ImmutableGeneratorFactory *)operator_new(0x40);
    ImmutableMessageGenerator::ImmutableMessageGenerator
              ((ImmutableMessageGenerator *)this_local,descriptor,this->context_);
  }
  else {
    this_local = (ImmutableGeneratorFactory *)operator_new(0x40);
    ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator
              ((ImmutableMessageLiteGenerator *)this_local,descriptor,this->context_);
  }
  return (MessageGenerator *)this_local;
}

Assistant:

MessageGenerator* ImmutableGeneratorFactory::NewMessageGenerator(
    const Descriptor* descriptor) const {
  if (HasDescriptorMethods(descriptor, context_->EnforceLite())) {
    return new ImmutableMessageGenerator(descriptor, context_);
  } else {
    return new ImmutableMessageLiteGenerator(descriptor, context_);
  }
}